

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

void __thiscall
ft::
deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~deque(deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this)

{
  pointer pcVar1;
  pointer pvVar2;
  pointer pvVar3;
  ulong uVar4;
  map_pointer ppvVar5;
  
  pvVar3 = (this->m_start).m_cur;
  if (pvVar3 != (this->m_finish).m_cur) {
    pvVar2 = (this->m_start).m_last;
    ppvVar5 = (this->m_start).m_node;
    do {
      pcVar1 = (pvVar3->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pvVar3->field_2) {
        operator_delete(pcVar1,(pvVar3->field_2)._M_allocated_capacity + 1);
      }
      pvVar3 = pvVar3 + 1;
      if (pvVar3 == pvVar2) {
        pvVar3 = ppvVar5[1];
        ppvVar5 = ppvVar5 + 1;
        pvVar2 = pvVar3 + 8;
      }
    } while (pvVar3 != (this->m_finish).m_cur);
  }
  if (this->m_map_size != 0) {
    uVar4 = 0;
    do {
      operator_delete(this->m_map[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->m_map_size);
  }
  operator_delete(this->m_map);
  return;
}

Assistant:

~deque() {
		chunk_allocator	chunk_alloc;

		for (iterator it = this->m_start; it != this->m_finish; ++it) {
			this->m_alloc.destroy(it.m_cur);
		}
		for (size_type i = 0; i < this->m_map_size; ++i) {
			chunk_alloc.destroy(this->m_map + i);
			this->m_alloc.deallocate(this->m_map[i], this->chunk_size());
		}
		chunk_alloc.deallocate(this->m_map, this->m_map_size);
	}